

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_t2cod.c
# Opt level: O3

void jpc_pchglist_destroy(jpc_pchglist_t *pchglist)

{
  jpc_pchg_t **ptr;
  long lVar1;
  
  ptr = pchglist->pchgs;
  if (ptr != (jpc_pchg_t **)0x0) {
    if (0 < pchglist->numpchgs) {
      lVar1 = 0;
      do {
        jas_free(pchglist->pchgs[lVar1]);
        lVar1 = lVar1 + 1;
      } while (lVar1 < pchglist->numpchgs);
      ptr = pchglist->pchgs;
    }
    jas_free(ptr);
  }
  jas_free(pchglist);
  return;
}

Assistant:

void jpc_pchglist_destroy(jpc_pchglist_t *pchglist)
{
	int pchgno;
	if (pchglist->pchgs) {
		for (pchgno = 0; pchgno < pchglist->numpchgs; ++pchgno) {
			jpc_pchg_destroy(pchglist->pchgs[pchgno]);
		}
		jas_free(pchglist->pchgs);
	}
	jas_free(pchglist);
}